

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

UninterpretedOption *
google::protobuf::DownCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  UninterpretedOption *pUVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_28;
  Voidify local_11;
  UninterpretedOption *local_10;
  MessageLite *from_local;
  
  local_10 = (UninterpretedOption *)from;
  pUVar1 = DynamicCastMessage<google::protobuf::UninterpretedOption>(from);
  if (pUVar1 == local_10) {
    return local_10;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
             ,0x595,"DynamicCastMessage<T>(from) == from");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [17])"Cannot downcast ");
  sVar3 = MessageLite::GetTypeName((MessageLite *)local_10);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])" to ");
  pUVar1 = UninterpretedOption::default_instance();
  sVar3 = MessageLite::GetTypeName((MessageLite *)pUVar1);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}